

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I422ToUYVYRow_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_frame,int width)

{
  int x;
  int width_local;
  uint8_t *dst_frame_local;
  uint8_t *src_v_local;
  uint8_t *src_u_local;
  uint8_t *src_y_local;
  
  dst_frame_local = dst_frame;
  src_v_local = src_v;
  src_u_local = src_u;
  src_y_local = src_y;
  for (x = 0; x < width + -1; x = x + 2) {
    *dst_frame_local = *src_u_local;
    dst_frame_local[1] = *src_y_local;
    dst_frame_local[2] = *src_v_local;
    dst_frame_local[3] = src_y_local[1];
    dst_frame_local = dst_frame_local + 4;
    src_y_local = src_y_local + 2;
    src_u_local = src_u_local + 1;
    src_v_local = src_v_local + 1;
  }
  if ((width & 1U) != 0) {
    *dst_frame_local = *src_u_local;
    dst_frame_local[1] = *src_y_local;
    dst_frame_local[2] = *src_v_local;
    dst_frame_local[3] = '\0';
  }
  return;
}

Assistant:

void I422ToUYVYRow_C(const uint8_t* src_y,
                     const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* dst_frame,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_frame[0] = src_u[0];
    dst_frame[1] = src_y[0];
    dst_frame[2] = src_v[0];
    dst_frame[3] = src_y[1];
    dst_frame += 4;
    src_y += 2;
    src_u += 1;
    src_v += 1;
  }
  if (width & 1) {
    dst_frame[0] = src_u[0];
    dst_frame[1] = src_y[0];
    dst_frame[2] = src_v[0];
    dst_frame[3] = 0;
  }
}